

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dayperiodrules.cpp
# Opt level: O0

void __thiscall
icu_63::DayPeriodRulesDataSink::put
          (DayPeriodRulesDataSink *this,char *key,ResourceValue *value,UBool param_3,
          UErrorCode *errorCode)

{
  undefined1 auVar1 [16];
  UBool UVar2;
  int iVar3;
  int32_t value_00;
  ulong uVar4;
  UMemory *this_00;
  DayPeriodRules *pDVar5;
  char *size;
  DayPeriodRules *local_168;
  DayPeriodRules *local_148;
  undefined1 local_128 [8];
  ResourceTable rules;
  undefined1 local_d0 [4];
  int32_t setNum;
  UnicodeString setNum_str;
  undefined1 local_88 [4];
  int32_t j;
  ResourceTable locales;
  undefined1 local_58 [4];
  int32_t i;
  ResourceTable dayPeriodData;
  UErrorCode *errorCode_local;
  UBool param_3_local;
  ResourceValue *value_local;
  char *key_local;
  DayPeriodRulesDataSink *this_local;
  
  dayPeriodData._32_8_ = errorCode;
  value_local = (ResourceValue *)key;
  key_local = (char *)this;
  (*(value->super_UObject)._vptr_UObject[0xb])(local_58,value,errorCode);
  UVar2 = ::U_FAILURE(*(UErrorCode *)dayPeriodData._32_8_);
  if (UVar2 == '\0') {
    locales._36_4_ = 0;
    while (UVar2 = ResourceTable::getKeyAndValue
                             ((ResourceTable *)local_58,locales._36_4_,(char **)&value_local,value),
          UVar2 != '\0') {
      iVar3 = strcmp((char *)value_local,"locales");
      if (iVar3 == 0) {
        (*(value->super_UObject)._vptr_UObject[0xb])(local_88,value,dayPeriodData._32_8_);
        UVar2 = ::U_FAILURE(*(UErrorCode *)dayPeriodData._32_8_);
        if (UVar2 != '\0') {
          return;
        }
        setNum_str.fUnion._52_4_ = 0;
        while (UVar2 = ResourceTable::getKeyAndValue
                                 ((ResourceTable *)local_88,setNum_str.fUnion._52_4_,
                                  (char **)&value_local,value), UVar2 != '\0') {
          ResourceValue::getUnicodeString
                    ((UnicodeString *)local_d0,value,(UErrorCode *)dayPeriodData._32_8_);
          value_00 = parseSetNum((UnicodeString *)local_d0,(UErrorCode *)dayPeriodData._32_8_);
          uhash_puti_63((UHashtable *)*(anonymous_namespace)::data,value_local,value_00,
                        (UErrorCode *)dayPeriodData._32_8_);
          icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_d0);
          setNum_str.fUnion._52_4_ = setNum_str.fUnion._52_4_ + 1;
        }
      }
      else {
        size = "rules";
        iVar3 = strcmp((char *)value_local,"rules");
        if (iVar3 == 0) {
          uVar4 = (ulong)(*(int *)((anonymous_namespace)::data + 2) + 1);
          auVar1._8_8_ = 0;
          auVar1._0_8_ = uVar4;
          this_00 = SUB168(auVar1 * ZEXT816(100),0);
          if (SUB168(auVar1 * ZEXT816(100),8) != 0) {
            this_00 = (UMemory *)0xffffffffffffffff;
          }
          pDVar5 = (DayPeriodRules *)UMemory::operator_new__(this_00,(size_t)size);
          rules._39_1_ = 0;
          local_148 = (DayPeriodRules *)0x0;
          if ((pDVar5 != (DayPeriodRules *)0x0) &&
             (rules._39_1_ = 1, local_148 = pDVar5, uVar4 != 0)) {
            local_168 = pDVar5;
            do {
              DayPeriodRules::DayPeriodRules(local_168);
              local_168 = local_168 + 1;
            } while (local_168 != pDVar5 + uVar4);
          }
          (anonymous_namespace)::data[1] = local_148;
          if ((anonymous_namespace)::data[1] == 0) {
            *(undefined4 *)dayPeriodData._32_8_ = 7;
            return;
          }
          (*(value->super_UObject)._vptr_UObject[0xb])(local_128,value,dayPeriodData._32_8_);
          processRules(this,(ResourceTable *)local_128,(char *)value_local,value,
                       (UErrorCode *)dayPeriodData._32_8_);
          UVar2 = ::U_FAILURE(*(UErrorCode *)dayPeriodData._32_8_);
          if (UVar2 != '\0') {
            return;
          }
        }
      }
      locales._36_4_ = locales._36_4_ + 1;
    }
  }
  return;
}

Assistant:

virtual void put(const char *key, ResourceValue &value, UBool, UErrorCode &errorCode) {
        ResourceTable dayPeriodData = value.getTable(errorCode);
        if (U_FAILURE(errorCode)) { return; }

        for (int32_t i = 0; dayPeriodData.getKeyAndValue(i, key, value); ++i) {
            if (uprv_strcmp(key, "locales") == 0) {
                ResourceTable locales = value.getTable(errorCode);
                if (U_FAILURE(errorCode)) { return; }

                for (int32_t j = 0; locales.getKeyAndValue(j, key, value); ++j) {
                    UnicodeString setNum_str = value.getUnicodeString(errorCode);
                    int32_t setNum = parseSetNum(setNum_str, errorCode);
                    uhash_puti(data->localeToRuleSetNumMap, const_cast<char *>(key), setNum, &errorCode);
                }
            } else if (uprv_strcmp(key, "rules") == 0) {
                // Allocate one more than needed to skip [0]. See comment in parseSetNum().
                data->rules = new DayPeriodRules[data->maxRuleSetNum + 1];
                if (data->rules == NULL) {
                    errorCode = U_MEMORY_ALLOCATION_ERROR;
                    return;
                }
                ResourceTable rules = value.getTable(errorCode);
                processRules(rules, key, value, errorCode);
                if (U_FAILURE(errorCode)) { return; }
            }
        }
    }